

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture1_CreateTest_CreateEmpty_Test::
~ktxTexture1_CreateTest_CreateEmpty_Test(ktxTexture1_CreateTest_CreateEmpty_Test *this)

{
  void *in_RDI;
  
  ~ktxTexture1_CreateTest_CreateEmpty_Test((ktxTexture1_CreateTest_CreateEmpty_Test *)0x12fbe8);
  operator_delete(in_RDI,0x1e0);
  return;
}

Assistant:

TEST_F(ktxTexture1_CreateTest, CreateEmpty) {
    ktxTexture1* texture = 0;
    KTX_error_code result;

    result = ktxTexture1_Create(&createInfo, KTX_TEXTURE_CREATE_NO_STORAGE,
                                &texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                 << ktxErrorString(result);
    if (texture)
        ktxTexture1_Destroy(texture);
}